

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuconnection.cpp
# Opt level: O2

bool __thiscall
QDBusMenuConnection::registerTrayIconWithWatcher(QDBusMenuConnection *this,QDBusTrayIcon *item)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<QVariant> local_78;
  QDBusMessage registerMethod;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _registerMethod = &DAT_aaaaaaaaaaaaaaaa;
  latin1.m_data = "RegisterStatusNotifierItem";
  latin1.m_size = 0x1a;
  QString::QString((QString *)&local_58,latin1);
  QDBusMessage::createMethodCall
            ((QString *)&registerMethod,(QString *)&StatusNotifierWatcherService,
             (QString *)&StatusNotifierWatcherPath,(QString *)&StatusNotifierWatcherService);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  local_78.d = (Data *)0x0;
  local_78.ptr = (QVariant *)0x0;
  local_78.size = 0;
  QDBusConnection::baseService();
  ::QVariant::QVariant(&local_58,(QString *)&local_90);
  QList<QVariant>::emplaceBack<QVariant>((QList<QVariant> *)&local_78,&local_58);
  QDBusMessage::setArguments((QList_conflict1 *)&registerMethod);
  ::QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_78);
  uVar1 = QDBusConnection::callWithCallback
                    ((QDBusMessage *)(this + 0x28),(QObject *)&registerMethod,(char *)this,
                     "2trayIconRegistered()",0x6191aa);
  QDBusMessage::~QDBusMessage(&registerMethod);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QDBusMenuConnection::registerTrayIconWithWatcher(QDBusTrayIcon *item)
{
    Q_UNUSED(item);
    QDBusMessage registerMethod = QDBusMessage::createMethodCall(
                StatusNotifierWatcherService, StatusNotifierWatcherPath, StatusNotifierWatcherService,
                "RegisterStatusNotifierItem"_L1);
    registerMethod.setArguments(QVariantList() << m_connection.baseService());
    return m_connection.callWithCallback(registerMethod, this, SIGNAL(trayIconRegistered()), SLOT(dbusError(QDBusError)));
}